

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.c
# Opt level: O0

void write_sei_payload(h264_stream_t *h,bs_t *b)

{
  sei_t *psVar1;
  int local_24;
  int i;
  sei_t *s;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  psVar1 = h->sei;
  if (psVar1->payloadType == 0x18) {
    write_sei_scalability_info(h,b);
  }
  else {
    for (local_24 = 0; local_24 < psVar1->payloadSize; local_24 = local_24 + 1) {
      bs_write_u8(b,(uint)*(byte *)((long)((psVar1->field_2).sei_svc)->layers[0].roi +
                                   (long)local_24 + -0x4a));
    }
  }
  return;
}

Assistant:

void write_sei_payload( h264_stream_t* h, bs_t* b )
{
    sei_t* s = h->sei;
    
    int i;
    switch( s->payloadType )
    {
        case SEI_TYPE_SCALABILITY_INFO:
            if( 0 )
            {
                s->sei_svc = (sei_scalability_info_t*)calloc( 1, sizeof(sei_scalability_info_t) );
            }
            write_sei_scalability_info( h, b );
            break;
        default:
            if( 0 )
            {
                s->data = (uint8_t*)calloc(1, s->payloadSize);
            }
            
            for ( i = 0; i < s->payloadSize; i++ )
                bs_write_u8(b, s->data[i]);
    }
    
    //if( 0 )
    //    read_sei_end_bits(h, b);
}